

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::SSLTest_SigAlgs_Test::TestBody(SSLTest_SigAlgs_Test *this)

{
  int *values;
  pointer puVar1;
  int iVar2;
  SSL_METHOD *meth;
  bool *rhs;
  pointer *__ptr;
  char *message;
  char *in_R9;
  int iVar3;
  pointer *__ptr_2;
  long lVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<unsigned_short> __l_04;
  initializer_list<int> __l_05;
  initializer_list<unsigned_short> __l_06;
  initializer_list<int> __l_07;
  initializer_list<unsigned_short> __l_08;
  initializer_list<int> __l_09;
  initializer_list<unsigned_short> __l_10;
  initializer_list<int> __l_11;
  initializer_list<unsigned_short> __l_12;
  Span<const_unsigned_short> expected;
  ScopedTrace gtest_trace_6324;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<SSL_CTX> ctx;
  bool ok;
  AssertHelper local_b8;
  allocator_type local_ae;
  allocator_type local_ad;
  allocator_type local_ac;
  allocator_type local_ab;
  allocator_type local_aa;
  allocator_type local_a9;
  allocator_type local_a8;
  allocator_type local_a7;
  allocator_type local_a6;
  allocator_type local_a5;
  allocator_type local_a4;
  allocator_type local_a3;
  allocator_type local_a2;
  allocator_type local_a1;
  AssertHelper local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_68;
  undefined4 local_60;
  bool local_58 [8];
  unsigned_short local_50 [4];
  int local_48;
  unsigned_short local_44 [2];
  int local_40 [4];
  
  if (((anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests),
     iVar3 != 0)) {
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[0].input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TestBody::kTests[0].ok = true;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[0].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48 = 1;
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[1].input,__l,&local_a1);
    TestBody::kTests[1].ok = false;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[1].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_head_impl = (ssl_ctx_st *)0x200000001;
    local_60 = 3;
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_68;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[2].input,__l_00,&local_a2);
    TestBody::kTests[2].ok = false;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[2].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.data_ = (AssertHelperData *)0x3b5000002a0;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_b8;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[3].input,__l_01,&local_a3);
    TestBody::kTests[3].ok = false;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[3].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = (undefined1  [8])0x6000002a0;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6000002a0;
    __l_02._M_len = 4;
    __l_02._M_array = (iterator)local_88;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[4].input,__l_02,&local_a4);
    TestBody::kTests[4].ok = false;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kTests[4].expected.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.data_ = (AssertHelperData *)0x6000002a0;
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&local_a0;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[5].input,__l_03,&local_a5);
    TestBody::kTests[5].ok = true;
    local_50[3] = 0x401;
    __l_04._M_len = 1;
    __l_04._M_array = local_50 + 3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[5].expected,__l_04,&local_a6);
    local_58[0] = true;
    local_58[1] = true;
    local_58[2] = false;
    local_58[3] = false;
    local_58[4] = true;
    local_58[5] = false;
    local_58[6] = false;
    local_58[7] = false;
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)local_58;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[6].input,__l_05,&local_a7);
    TestBody::kTests[6].ok = true;
    local_50[2] = 0x601;
    __l_06._M_len = 1;
    __l_06._M_array = local_50 + 2;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[6].expected,__l_06,&local_a8);
    local_40[2] = 0x2a0;
    local_40[3] = 0x390;
    __l_07._M_len = 2;
    __l_07._M_array = local_40 + 2;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[7].input,__l_07,&local_a9);
    TestBody::kTests[7].ok = true;
    local_50[1] = 0x804;
    __l_08._M_len = 1;
    __l_08._M_array = local_50 + 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[7].expected,__l_08,&local_aa);
    local_40[0] = 0;
    local_40[1] = 0x3b5;
    __l_09._M_len = 2;
    __l_09._M_array = local_40;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[8].input,__l_09,&local_ab);
    TestBody::kTests[8].ok = true;
    local_50[0] = 0x807;
    __l_10._M_len = 1;
    __l_10._M_array = local_50;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[8].expected,__l_10,&local_ac);
    local_98._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b500000000;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x198000002a1;
    __l_11._M_len = 4;
    __l_11._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector(&TestBody::kTests[9].input,__l_11,&local_ad);
    TestBody::kTests[9].ok = true;
    local_44[0] = 0x807;
    local_44[1] = 0x503;
    __l_12._M_len = 2;
    __l_12._M_array = local_44;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&TestBody::kTests[9].expected,__l_12,&local_ae);
    __cxa_atexit(__cxx_global_array_dtor_1242,0,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::SSLTest_SigAlgs_Test::TestBody()::kTests);
  }
  meth = (SSL_METHOD *)TLS_method();
  local_68._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_98._M_head_impl._0_1_ = local_68._M_head_impl != (SSL_CTX *)0x0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_98,(AssertionResult *)0x3442d9,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x18b0,(char *)local_88);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
    }
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b8.data_ + 8))();
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
  }
  else {
    iVar3 = 1;
    rhs = &TestBody::kTests[0].ok;
    lVar4 = 0x230;
    do {
      local_88._0_4_ = iVar3;
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                ((ScopedTrace *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x18b4,(uint *)local_88);
      values = (((anon_struct_56_3_5277038f *)(rhs + -0x18))->input).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar2 = SSL_CTX_set1_sigalgs
                        (local_68._M_head_impl,values,
                         (long)*(pointer *)(rhs + -0x10) - (long)values >> 2);
      local_58[0] = iVar2 != 0;
      testing::internal::CmpHelperEQ<bool,bool>((internal *)local_88,"ok","test.ok",local_58,rhs);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        message = "";
        if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          message = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x18b8,message);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (local_98._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_98._M_head_impl + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      if (local_58[0] == false) {
        ERR_clear_error();
      }
      if (*rhs == true) {
        puVar1 = (((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(rhs + 8))->
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        expected.size_ = (long)*(pointer *)(rhs + 0x10) - (long)puVar1 >> 1;
        expected.data_ = puVar1;
        ExpectSigAlgsEqual(expected,*(Span<const_unsigned_short> *)
                                     ((long)((((local_68._M_head_impl)->cert)._M_t.
                                              super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bssl::CERT_*,_false>.
                                             _M_head_impl)->legacy_credential)._M_t.
                                            super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                     + 0x20));
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_a0);
      rhs = rhs + 0x38;
      iVar3 = iVar3 + 1;
      lVar4 = lVar4 + -0x38;
    } while (lVar4 != 0);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_68);
  return;
}

Assistant:

TEST(SSLTest, SigAlgs) {
  static const struct {
    std::vector<int> input;
    bool ok;
    std::vector<uint16_t> expected;
  } kTests[] = {
      {{}, true, {}},
      {{1}, false, {}},
      {{1, 2, 3}, false, {}},
      {{NID_sha256, EVP_PKEY_ED25519}, false, {}},
      {{NID_sha256, EVP_PKEY_RSA, NID_sha256, EVP_PKEY_RSA}, false, {}},

      {{NID_sha256, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA256}},
      {{NID_sha512, EVP_PKEY_RSA}, true, {SSL_SIGN_RSA_PKCS1_SHA512}},
      {{NID_sha256, EVP_PKEY_RSA_PSS}, true, {SSL_SIGN_RSA_PSS_RSAE_SHA256}},
      {{NID_undef, EVP_PKEY_ED25519}, true, {SSL_SIGN_ED25519}},
      {{NID_undef, EVP_PKEY_ED25519, NID_sha384, EVP_PKEY_EC},
       true,
       {SSL_SIGN_ED25519, SSL_SIGN_ECDSA_SECP384R1_SHA384}},
  };

  UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  unsigned n = 1;
  for (const auto &test : kTests) {
    SCOPED_TRACE(n++);

    const bool ok =
        SSL_CTX_set1_sigalgs(ctx.get(), test.input.data(), test.input.size());
    EXPECT_EQ(ok, test.ok);

    if (!ok) {
      ERR_clear_error();
    }

    if (!test.ok) {
      continue;
    }

    ExpectSigAlgsEqual(test.expected, ctx->cert->legacy_credential->sigalgs);
  }
}